

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O2

bool __thiscall
absl::lts_20250127::str_format_internal::FormatArgImpl::
Dispatch<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  wstring_view v;
  StringConvertResult SVar1;
  FormatConversionSpecImpl conv;
  
  if ((((ulong)arg.ptr & 0xff) == 0x13) || ((2L << (arg.buf[0] & 0x3f) & 0x80004U) == 0)) {
    SVar1.value = false;
  }
  else {
    v._M_len = *(size_t *)&this->data_;
    v._M_str = (wchar_t *)this->dispatcher_;
    conv.precision_ = spec._0_4_;
    conv._0_8_ = arg.ptr;
    SVar1 = str_format_internal::FormatConvertImpl
                      (v,conv,(FormatSinkImpl *)
                              CONCAT44((int)((ulong)register0x00000008 >> 0x20),spec.precision_));
  }
  return (bool)(SVar1.value & 1);
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }